

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::expand(QTreeView *this,QModelIndex *index)

{
  QTreeViewPrivate *this_00;
  bool bVar1;
  ItemFlags IVar2;
  int item;
  long in_FS_OFFSET;
  QPersistentModelIndex QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar1 = QAbstractItemViewPrivate::isIndexValid(&this_00->super_QAbstractItemViewPrivate,index);
  if (bVar1) {
    IVar2 = QModelIndex::flags(index);
    if (-1 < (char)IVar2.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                   super_QFlagsStorage<Qt::ItemFlag>.i) {
      bVar1 = QTreeViewPrivate::isIndexExpanded(this_00,index);
      if (!bVar1) {
        if ((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout != true) {
          item = QTreeViewPrivate::viewIndex(this_00,index);
          if (item != -1) {
            QTreeViewPrivate::expand(this_00,item,true);
            if ((this_00->super_QAbstractItemViewPrivate).state != AnimatingState) {
              (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x268))(this);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                QWidget::update((this_00->super_QAbstractItemViewPrivate).
                                super_QAbstractScrollAreaPrivate.viewport);
                return;
              }
              goto LAB_0053fade;
            }
            goto LAB_0053fac1;
          }
        }
        QPersistentModelIndex::QPersistentModelIndex(&QStack_38,index);
        bVar1 = QTreeViewPrivate::storeExpanded(this_00,&QStack_38);
        QPersistentModelIndex::~QPersistentModelIndex(&QStack_38);
        if (bVar1) {
          expanded(this,index);
        }
      }
    }
  }
LAB_0053fac1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0053fade:
  __stack_chk_fail();
}

Assistant:

void QTreeView::expand(const QModelIndex &index)
{
    Q_D(QTreeView);
    if (!d->isIndexValid(index))
        return;
    if (index.flags() & Qt::ItemNeverHasChildren)
        return;
    if (d->isIndexExpanded(index))
        return;
    if (d->delayedPendingLayout) {
        //A complete relayout is going to be performed, just store the expanded index, no need to layout.
        if (d->storeExpanded(index))
            emit expanded(index);
        return;
    }

    int i = d->viewIndex(index);
    if (i != -1) { // is visible
        d->expand(i, true);
        if (!d->isAnimating()) {
            updateGeometries();
            d->viewport->update();
        }
    } else if (d->storeExpanded(index)) {
        emit expanded(index);
    }
}